

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.h
# Opt level: O3

void __thiscall flow::TargetCodeGenerator::~TargetCodeGenerator(TargetCodeGenerator *this)

{
  ~TargetCodeGenerator(this);
  operator_delete(this,0x2b8);
  return;
}

Assistant:

~TargetCodeGenerator() = default;